

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_trainer.cc
# Opt level: O0

Status sentencepiece::SentencePieceTrainer::PopulateNormalizerSpec
                 (NormalizerSpec *normalizer_spec,bool is_denormalizer)

{
  bool bVar1;
  ulong uVar2;
  string *psVar3;
  byte in_DL;
  long in_RSI;
  unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
  in_RDI;
  CharsMap chars_map;
  CharsMap *in_stack_00000218;
  string_view in_stack_00000220;
  Status *_status;
  string *in_stack_00000be0;
  CharsMap *in_stack_00000be8;
  undefined4 in_stack_fffffffffffffbc8;
  undefined2 in_stack_fffffffffffffbcc;
  undefined1 in_stack_fffffffffffffbce;
  undefined1 in_stack_fffffffffffffbcf;
  StatusBuilder *in_stack_fffffffffffffbd0;
  StatusBuilder *in_stack_fffffffffffffc18;
  StatusBuilder *this;
  char *in_stack_fffffffffffffc78;
  undefined2 in_stack_fffffffffffffc80;
  undefined1 in_stack_fffffffffffffc82;
  undefined1 in_stack_fffffffffffffc83;
  byte bVar4;
  undefined4 in_stack_fffffffffffffc84;
  uint uVar5;
  StatusBuilder local_328;
  undefined4 local_1a8;
  string *in_stack_ffffffffffffffa8;
  string_view in_stack_ffffffffffffffb0;
  
  if (in_RSI == 0) {
    util::StatusBuilder::StatusBuilder
              (in_stack_fffffffffffffbd0,
               CONCAT13(in_stack_fffffffffffffbcf,
                        CONCAT12(in_stack_fffffffffffffbce,in_stack_fffffffffffffbcc)));
    util::StatusBuilder::operator<<
              (in_stack_fffffffffffffbd0,
               (char (*) [55])
               CONCAT17(in_stack_fffffffffffffbcf,
                        CONCAT16(in_stack_fffffffffffffbce,
                                 CONCAT24(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8))));
    util::StatusBuilder::operator<<
              (in_stack_fffffffffffffbd0,
               (char (*) [2])
               CONCAT17(in_stack_fffffffffffffbcf,
                        CONCAT16(in_stack_fffffffffffffbce,
                                 CONCAT24(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8))));
    local_1a8 = 0xee;
    util::StatusBuilder::operator<<
              (in_stack_fffffffffffffbd0,
               (int *)CONCAT17(in_stack_fffffffffffffbcf,
                               CONCAT16(in_stack_fffffffffffffbce,
                                        CONCAT24(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8
                                                ))));
    util::StatusBuilder::operator<<
              (in_stack_fffffffffffffbd0,
               (char (*) [4])
               CONCAT17(in_stack_fffffffffffffbcf,
                        CONCAT16(in_stack_fffffffffffffbce,
                                 CONCAT24(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8))));
    util::StatusBuilder::operator<<
              (in_stack_fffffffffffffbd0,
               (char (*) [16])
               CONCAT17(in_stack_fffffffffffffbcf,
                        CONCAT16(in_stack_fffffffffffffbce,
                                 CONCAT24(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8))));
    util::StatusBuilder::operator<<
              (in_stack_fffffffffffffbd0,
               (char (*) [3])
               CONCAT17(in_stack_fffffffffffffbcf,
                        CONCAT16(in_stack_fffffffffffffbce,
                                 CONCAT24(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8))));
    util::StatusBuilder::operator_cast_to_Status(in_stack_fffffffffffffc18);
    util::StatusBuilder::~StatusBuilder((StatusBuilder *)0x4cfe4b);
    return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
              )in_RDI._M_t.
               super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
               ._M_t.
               super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
               .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl;
  }
  NormalizerSpec::normalization_rule_tsv_abi_cxx11_((NormalizerSpec *)0x4cfe83);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    NormalizerSpec::precompiled_charsmap_abi_cxx11_((NormalizerSpec *)0x4cfea0);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      this = &local_328;
      util::StatusBuilder::StatusBuilder
                (in_stack_fffffffffffffbd0,
                 CONCAT13(in_stack_fffffffffffffbcf,
                          CONCAT12(in_stack_fffffffffffffbce,in_stack_fffffffffffffbcc)));
      util::StatusBuilder::operator<<
                (in_stack_fffffffffffffbd0,
                 (char (*) [55])
                 CONCAT17(in_stack_fffffffffffffbcf,
                          CONCAT16(in_stack_fffffffffffffbce,
                                   CONCAT24(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8))));
      util::StatusBuilder::operator<<
                (in_stack_fffffffffffffbd0,
                 (char (*) [2])
                 CONCAT17(in_stack_fffffffffffffbcf,
                          CONCAT16(in_stack_fffffffffffffbce,
                                   CONCAT24(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8))));
      util::StatusBuilder::operator<<
                (in_stack_fffffffffffffbd0,
                 (int *)CONCAT17(in_stack_fffffffffffffbcf,
                                 CONCAT16(in_stack_fffffffffffffbce,
                                          CONCAT24(in_stack_fffffffffffffbcc,
                                                   in_stack_fffffffffffffbc8))));
      util::StatusBuilder::operator<<
                (in_stack_fffffffffffffbd0,
                 (char (*) [4])
                 CONCAT17(in_stack_fffffffffffffbcf,
                          CONCAT16(in_stack_fffffffffffffbce,
                                   CONCAT24(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8))));
      util::StatusBuilder::operator<<
                (in_stack_fffffffffffffbd0,
                 (char (*) [48])
                 CONCAT17(in_stack_fffffffffffffbcf,
                          CONCAT16(in_stack_fffffffffffffbce,
                                   CONCAT24(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8))));
      util::StatusBuilder::operator<<
                (in_stack_fffffffffffffbd0,
                 (char (*) [3])
                 CONCAT17(in_stack_fffffffffffffbcf,
                          CONCAT16(in_stack_fffffffffffffbce,
                                   CONCAT24(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8))));
      util::StatusBuilder::operator<<
                (in_stack_fffffffffffffbd0,
                 (char (*) [41])
                 CONCAT17(in_stack_fffffffffffffbcf,
                          CONCAT16(in_stack_fffffffffffffbce,
                                   CONCAT24(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8))));
      util::StatusBuilder::operator_cast_to_Status(this);
      util::StatusBuilder::~StatusBuilder((StatusBuilder *)0x4cff9f);
      return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
              )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                )in_RDI._M_t.
                 super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                 .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl;
    }
    std::
    map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::map((map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           *)0x4cffd7);
    psVar3 = NormalizerSpec::normalization_rule_tsv_abi_cxx11_((NormalizerSpec *)0x4cffec);
    std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
    normalizer::Builder::LoadCharsMap(in_stack_00000220,in_stack_00000218);
    bVar1 = util::Status::ok((Status *)0x4d0041);
    uVar5 = (uint)!bVar1;
    if (bVar1) {
      util::Status::~Status((Status *)0x4d00c7);
    }
    if (uVar5 == 0) {
      bVar4 = 0;
      NormalizerSpec::mutable_precompiled_charsmap_abi_cxx11_((NormalizerSpec *)0x4d00f3);
      normalizer::Builder::CompileCharsMap(in_stack_00000be8,in_stack_00000be0);
      bVar1 = util::Status::ok((Status *)0x4d0123);
      if (!bVar1) {
        bVar4 = 1;
      }
      uVar5 = (uint)!bVar1;
      if ((bVar4 & 1) == 0) {
        util::Status::~Status((Status *)0x4d018d);
      }
      if (uVar5 == 0) {
        NormalizerSpec::set_name
                  ((NormalizerSpec *)
                   (ulong)CONCAT13(bVar4,CONCAT12(in_stack_fffffffffffffc82,
                                                  in_stack_fffffffffffffc80)),
                   in_stack_fffffffffffffc78);
        uVar5 = 0;
      }
    }
    std::
    map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::~map((map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
            *)0x4d01cc);
  }
  else {
    if ((in_DL & 1) != 0) goto LAB_004d033a;
    NormalizerSpec::name_abi_cxx11_((NormalizerSpec *)0x4d0210);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      NormalizerSpec::set_name
                ((NormalizerSpec *)
                 CONCAT44(in_stack_fffffffffffffc84,
                          CONCAT13(in_stack_fffffffffffffc83,
                                   CONCAT12(in_stack_fffffffffffffc82,in_stack_fffffffffffffc80))),
                 in_stack_fffffffffffffc78);
    }
    NormalizerSpec::precompiled_charsmap_abi_cxx11_((NormalizerSpec *)0x4d023f);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) goto LAB_004d033a;
    bVar4 = 0;
    psVar3 = NormalizerSpec::name_abi_cxx11_((NormalizerSpec *)0x4d0267);
    std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
    NormalizerSpec::mutable_precompiled_charsmap_abi_cxx11_((NormalizerSpec *)0x4d028c);
    normalizer::Builder::GetPrecompiledCharsMap(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8)
    ;
    bVar1 = util::Status::ok((Status *)0x4d02b9);
    if (!bVar1) {
      bVar4 = 1;
    }
    uVar5 = (uint)!bVar1;
    if ((bVar4 & 1) == 0) {
      util::Status::~Status((Status *)0x4d0323);
    }
  }
  if (uVar5 != 0) {
    return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
              )in_RDI._M_t.
               super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
               ._M_t.
               super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
               .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl;
  }
LAB_004d033a:
  util::OkStatus();
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )in_RDI._M_t.
             super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
             ._M_t.
             super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
             .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl;
}

Assistant:

util::Status SentencePieceTrainer::PopulateNormalizerSpec(
    NormalizerSpec *normalizer_spec, bool is_denormalizer) {
  CHECK_OR_RETURN(normalizer_spec);

  if (!normalizer_spec->normalization_rule_tsv().empty()) {
    CHECK_OR_RETURN(normalizer_spec->precompiled_charsmap().empty())
        << "precompiled_charsmap is already defined.";
    normalizer::Builder::CharsMap chars_map;
    RETURN_IF_ERROR(normalizer::Builder::LoadCharsMap(
        normalizer_spec->normalization_rule_tsv(), &chars_map));
    RETURN_IF_ERROR(normalizer::Builder::CompileCharsMap(
        chars_map, normalizer_spec->mutable_precompiled_charsmap()));
    normalizer_spec->set_name("user_defined");
  } else if (!is_denormalizer) {
    if (normalizer_spec->name().empty()) {
      normalizer_spec->set_name(kDefaultNormalizerName);
    }
    if (normalizer_spec->precompiled_charsmap().empty()) {
      RETURN_IF_ERROR(normalizer::Builder::GetPrecompiledCharsMap(
          normalizer_spec->name(),
          normalizer_spec->mutable_precompiled_charsmap()));
    }
  }

  return util::OkStatus();
}